

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SmallVector<spirv_cross::Variant,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::Variant,_8UL>::operator=
          (SmallVector<spirv_cross::Variant,_8UL> *this,
          SmallVector<spirv_cross::Variant,_8UL> *other)

{
  undefined8 *puVar1;
  Variant *pVVar2;
  Variant *pVVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  clear(this);
  if ((other->super_VectorView<spirv_cross::Variant>).ptr == (Variant *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::Variant>).buffer_size);
    uVar4 = (other->super_VectorView<spirv_cross::Variant>).buffer_size;
    if (uVar4 != 0) {
      lVar6 = 0;
      uVar5 = 0;
      do {
        pVVar2 = (this->super_VectorView<spirv_cross::Variant>).ptr;
        pVVar3 = (other->super_VectorView<spirv_cross::Variant>).ptr;
        puVar1 = (undefined8 *)((long)&pVVar2->group + lVar6);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pVVar2->holder + lVar6 + 5) = 0;
        Variant::operator=((Variant *)((long)&pVVar2->group + lVar6),
                           (Variant *)((long)&pVVar3->group + lVar6));
        Variant::~Variant((Variant *)
                          ((long)&((other->super_VectorView<spirv_cross::Variant>).ptr)->group +
                          lVar6));
        uVar5 = uVar5 + 1;
        uVar4 = (other->super_VectorView<spirv_cross::Variant>).buffer_size;
        lVar6 = lVar6 + 0x18;
      } while (uVar5 < uVar4);
    }
    (this->super_VectorView<spirv_cross::Variant>).buffer_size = uVar4;
    (other->super_VectorView<spirv_cross::Variant>).buffer_size = 0;
  }
  else {
    pVVar2 = (this->super_VectorView<spirv_cross::Variant>).ptr;
    if (pVVar2 != (Variant *)&this->stack_storage) {
      free(pVVar2);
    }
    (this->super_VectorView<spirv_cross::Variant>).ptr =
         (other->super_VectorView<spirv_cross::Variant>).ptr;
    (this->super_VectorView<spirv_cross::Variant>).buffer_size =
         (other->super_VectorView<spirv_cross::Variant>).buffer_size;
    this->buffer_capacity = other->buffer_capacity;
    (other->super_VectorView<spirv_cross::Variant>).ptr = (Variant *)0x0;
    (other->super_VectorView<spirv_cross::Variant>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}